

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::zext(APInt *this,uint width)

{
  uint64_t *puVar1;
  int iVar2;
  uint64_t *__dest;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  uint64_t *__src;
  ulong __n;
  uint numWords;
  APInt AVar4;
  
  __src = (uint64_t *)CONCAT44(in_register_00000034,width);
  if ((uint)__src[1] < in_EDX) {
    if (in_EDX < 0x41) {
      APInt(this,in_EDX,*__src,false);
      uVar3 = extraout_RDX;
    }
    else {
      numWords = (uint)((ulong)in_EDX + 0x3f >> 6);
      __dest = getMemory(numWords);
      this->BitWidth = in_EDX;
      (this->U).pVal = __dest;
      puVar1 = __src + 1;
      if (0x40 < (ulong)(uint)*puVar1) {
        __src = (uint64_t *)*__src;
      }
      iVar2 = (int)((ulong)(uint)*puVar1 + 0x3f >> 6);
      __n = (ulong)(uint)(iVar2 * 8);
      memcpy(__dest,__src,__n);
      memset((void *)((long)__dest + __n),0,(ulong)((numWords - iVar2) * 8));
      uVar3 = extraout_RDX_00;
    }
    AVar4._8_8_ = uVar3;
    AVar4.U.pVal = (uint64_t *)this;
    return AVar4;
  }
  __assert_fail("width > BitWidth && \"Invalid APInt ZeroExtend request\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x361,"APInt llvm::APInt::zext(unsigned int) const");
}

Assistant:

APInt APInt::zext(unsigned width) const {
  assert(width > BitWidth && "Invalid APInt ZeroExtend request");

  if (width <= APINT_BITS_PER_WORD)
    return APInt(width, U.VAL);

  APInt Result(getMemory(getNumWords(width)), width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Zero remaining words.
  std::memset(Result.U.pVal + getNumWords(), 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);

  return Result;
}